

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O2

void __thiscall LSM_tree::recover(LSM_tree *this)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  Level *this_00;
  Sstable *pSVar6;
  ostream *poVar7;
  _List_node_base *p_Var8;
  LSM_tree *in_RSI;
  LSM_tree *this_01;
  LSM_tree *__return_storage_ptr__;
  bool del;
  ulong local_2c0;
  _List_node_base *local_2b8;
  Level *my_level;
  uint local_2a4;
  uint my_timer;
  uint offset;
  LSM_tree *local_298;
  _List_node_base *local_290;
  pairs *my_pair;
  uint64_t key;
  string file_name;
  string level_name;
  ifstream in;
  byte abStack_218 [488];
  
  local_2c0 = 0;
  local_298 = this;
  do {
    this_01 = (LSM_tree *)&level_name;
    get_level_name_abi_cxx11_((string *)this_01,in_RSI,(int)local_2c0);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&in,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               auto_format);
    bVar3 = std::filesystem::exists((path *)&in);
    std::filesystem::__cxx11::path::~path((path *)&in);
    if (bVar3) {
      this_00 = (Level *)operator_new(0x28);
      Level::Level(this_00,(int)local_2c0);
      this_01 = (LSM_tree *)&my_level;
      my_level = this_00;
      std::vector<Level_*,_std::allocator<Level_*>_>::push_back
                (&local_298->disk,(value_type *)this_01);
      local_2a4 = (int)local_2c0 + 1;
      bVar1 = (byte)local_2a4 & 0x1f;
      uVar2 = 1 << bVar1;
      if (1 << bVar1 < 1) {
        uVar2 = 0;
      }
      local_290 = (_List_node_base *)(ulong)uVar2;
      for (p_Var8 = (_List_node_base *)0x0; __return_storage_ptr__ = (LSM_tree *)&file_name,
          p_Var8 != local_290; p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1)) {
        local_2b8 = p_Var8;
        get_file_name_abi_cxx11_
                  ((string *)__return_storage_ptr__,this_01,(int)local_2c0,(int)p_Var8);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,auto_format);
        bVar4 = std::filesystem::exists((path *)&in);
        std::filesystem::__cxx11::path::~path((path *)&in);
        if (bVar4) {
          my_level->is_creat[(long)local_2b8] = true;
          std::ifstream::ifstream((path *)&in,(string *)&file_name,_S_in|_S_bin);
          cVar5 = std::__basic_file<char>::is_open();
          if (cVar5 == '\0') {
            poVar7 = std::operator<<((ostream *)&std::cout,"Error:open file");
            poVar7 = std::operator<<(poVar7,(string *)&file_name);
            std::endl<char,std::char_traits<char>>(poVar7);
            exit(0);
          }
          pSVar6 = (Sstable *)operator_new(0x20);
          *(pointer *)
           ((long)&(pSVar6->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl +
           0x10) = (pointer)0x0;
          (pSVar6->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
          super__Vector_impl_data._M_start = 0;
          *(pointer *)
           ((long)&(pSVar6->buffer).super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl +
           8) = (pointer)0x0;
          pSVar6->end = 0;
          std::istream::seekg((long)&in,0x200000);
          std::istream::tellg();
          std::istream::read((char *)&in,(long)pSVar6);
          std::istream::tellg();
          __return_storage_ptr__ = (LSM_tree *)0x200004;
          std::istream::seekg((long)&in,0x200004);
          std::istream::tellg();
          while ((abStack_218[*(long *)(_in + -0x18)] & 2) == 0) {
            std::istream::tellg();
            std::istream::read((char *)&in,(long)&key);
            std::istream::tellg();
            std::istream::read((char *)&in,(long)&offset);
            std::istream::tellg();
            std::istream::read((char *)&in,(long)&my_timer);
            std::istream::tellg();
            std::istream::read((char *)&in,(long)&del);
            std::istream::tellg();
            my_pair = (pairs *)operator_new(0x18);
            my_pair->key = key;
            my_pair->offset = offset;
            my_pair->timer = my_timer;
            my_pair->del = del;
            __return_storage_ptr__ = (LSM_tree *)&my_pair;
            std::vector<pairs_*,_std::allocator<pairs_*>_>::push_back
                      (&pSVar6->buffer,(value_type *)&my_pair);
          }
          std::ifstream::close();
          p_Var8 = local_2b8;
          (my_level->file).super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
          super__Vector_impl_data._M_start[(long)local_2b8] = pSVar6;
          std::ifstream::~ifstream((path *)&in);
        }
        else {
          my_level->is_creat[(long)local_2b8] = false;
          p_Var8 = local_2b8;
        }
        std::__cxx11::string::~string((string *)&file_name);
        this_01 = __return_storage_ptr__;
      }
      local_2c0 = (ulong)local_2a4;
    }
    std::__cxx11::string::~string((string *)&level_name);
    in_RSI = this_01;
    if (!bVar3) {
      std::operator<<((ostream *)&std::cout,"recover finished\n");
      return;
    }
  } while( true );
}

Assistant:

void LSM_tree::recover() {
    int level_id=0;


    while(true)
    {
        std::string level_name=get_level_name(level_id);
        if(!fs::exists(level_name)) break;
        Level* my_level=new Level(level_id);
        disk.push_back(my_level);

        //看看这层由上面文件 读一下
        for(int file_id=0;file_id<(1<<(level_id+1));file_id++)
        {
            std::string file_name=get_file_name(level_id,file_id);
            //如果这个文件存在 就都进去
            if(!fs::exists(file_name)){
                my_level->is_creat[file_id]=false;
                continue;
            }
            else my_level->is_creat[file_id]=true;

            //打开文件
            ifstream in(file_name, ios::in | ios::binary);
            if (!in.is_open()) {
                cout << "Error:open file" << file_name << endl;
                exit(0);
            }

            //新建索引区
            Sstable * my_sstable =new Sstable;
            //找到索引区起始位置
            in.seekg(INDEX_BEGIN,ios::beg);
            int o4=in.tellg();
            in.read((char*)&my_sstable->end, sizeof(unsigned int));
           int o5=in.tellg();
            in.seekg(INDEX_BEGIN+ sizeof(unsigned int),ios::beg);
            int o6=in.tellg();
            while (!in.eof())
            {
                uint64_t key;
                unsigned int offset;
                unsigned int my_timer;
                bool del;

                int o0=in.tellg();
                in.read((char*)&key,sizeof(uint64_t));
                int o1=in.tellg();
                in.read((char*)&offset,sizeof(unsigned int));
                int o2=in.tellg();
                in.read((char*)&my_timer, sizeof(unsigned int));
                int o3=in.tellg();
                in.read((char*)&del,sizeof(bool));
                int o4=in.tellg();

                pairs* my_pair=new pairs(key,offset,my_timer,del);
                my_sstable->buffer.push_back(my_pair);
            }
            in.close();

            //把sstable写进level
            my_level->file[file_id]=my_sstable;



        }
        level_id++;

    }

    cout<<"recover finished\n";

}